

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O0

void __thiscall
LogManager::Logger<std::shared_ptr<spdlog::logger>_>::Logger
          (Logger<std::shared_ptr<spdlog::logger>_> *this,
          ILogger<std::shared_ptr<spdlog::logger>_> **logger)

{
  ILogger<std::shared_ptr<spdlog::logger>_> *in_RDI;
  shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>_>
  *in_stack_ffffffffffffffe0;
  
  Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>::ILogger
            ((ILogger<std::shared_ptr<spdlog::logger>_> *)0x10b69c);
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__Logger_001a7eb0;
  std::shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>>::
  shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>>,void>
            (in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

Logger(Interfaces::ILogger<T>*&& logger) : m_logger(logger) {}